

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O1

void Gia_ManPrintObjClasses(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint *__s;
  int *__s_00;
  void *__s_01;
  int iVar10;
  int iVar11;
  uint *puVar12;
  size_t __size;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint *puVar20;
  int local_8c;
  
  pVVar4 = p->vObjClasses;
  if (pVVar4 == (Vec_Int_t *)0x0) {
    return;
  }
  uVar2 = pVVar4->nSize;
  if (0 < (int)uVar2) {
    uVar15 = *pVVar4->pArray;
    uVar19 = (ulong)(int)uVar15;
    if ((-2 < (long)uVar19) && (uVar17 = uVar19 + 1, (int)uVar17 < (int)uVar2)) {
      if (pVVar4->pArray[uVar17 & 0xffffffff] != uVar2) {
        __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x17a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      __size = uVar17 * 4;
      __s = (uint *)malloc(__size);
      __s_00 = (int *)malloc(__size);
      iVar11 = (((int)uVar15 >> 5) + 1) - (uint)((uVar15 & 0x1f) == 0);
      uVar2 = p->nObjs;
      iVar10 = uVar2 * iVar11;
      iVar7 = 0x10;
      if (0xe < iVar10 - 1U) {
        iVar7 = iVar10;
      }
      if (iVar7 == 0) {
        __s_01 = (void *)0x0;
      }
      else {
        __s_01 = malloc((long)iVar7 << 2);
      }
      if (__s_01 != (void *)0x0) {
        memset(__s_01,0,(long)iVar10 << 2);
      }
      uVar8 = uVar2;
      if (1 < uVar2) {
        uVar8 = uVar2 - 1;
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          iVar7 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          uVar8 = iVar7 + 0x21;
        }
      }
      local_8c = -1;
      uVar9 = ~(-1 << ((byte)uVar8 & 0x1f));
      if ((int)uVar9 < (int)uVar2) {
        __assert_fail("Gia_ManObjNum(p) <= nObjMask",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x183,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      puts("Frame   Core   F0   F1   F2   F3 ...");
      if (0 < (int)uVar15) {
        puVar20 = __s + -3;
        lVar14 = 1;
        uVar17 = 0;
        do {
          uVar1 = uVar17 + 1;
          if (((long)pVVar4->nSize <= (long)uVar1) || ((long)pVVar4->nSize <= (long)(uVar17 + 2)))
          goto LAB_005f1a81;
          piVar5 = pVVar4->pArray;
          uVar2 = piVar5[uVar1];
          local_8c = piVar5[uVar17 + 2];
          memset(__s,0,__size);
          memset(__s_00,0,__size);
          if ((int)uVar2 < local_8c) {
            puVar12 = (uint *)(piVar5 + uVar2);
            uVar15 = uVar2;
            do {
              if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar15)) goto LAB_005f1a81;
              uVar16 = (int)*puVar12 >> ((byte)uVar8 & 0x1f);
              uVar18 = (*puVar12 & uVar9) * iVar11;
              if (((int)uVar18 < 0) || (iVar10 <= (int)uVar18)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              uVar3 = *(uint *)((long)__s_01 + (long)((int)uVar16 >> 5) * 4 + (ulong)uVar18 * 4);
              if ((uVar3 >> (uVar16 & 0x1f) & 1) == 0) {
                *(uint *)((long)__s_01 + (long)((int)uVar16 >> 5) * 4 + (ulong)uVar18 * 4) =
                     uVar3 | 1 << (uVar16 & 0x1f);
                __s_00[(long)(int)uVar16 + 1] = __s_00[(long)(int)uVar16 + 1] + 1;
                *__s_00 = *__s_00 + 1;
              }
              __s[(long)(int)uVar16 + 1] = __s[(long)(int)uVar16 + 1] + 1;
              *__s = *__s + 1;
              uVar15 = uVar15 + 1;
              puVar12 = puVar12 + 1;
            } while ((int)uVar15 < local_8c);
          }
          uVar15 = *__s;
          if (uVar15 != local_8c - uVar2) {
            __assert_fail("pCountAll[0] == (iStop - iStart)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                          ,0x19a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
          }
          printf("%3d :",uVar17 & 0xffffffff);
          printf("%7d",(ulong)uVar15);
          lVar13 = 0;
          if (uVar17 < 10) {
            do {
              printf("%5d",(ulong)__s[lVar13 + 1]);
              lVar13 = lVar13 + 1;
            } while (lVar14 != lVar13);
          }
          else {
            do {
              lVar6 = lVar13 + 1;
              lVar13 = lVar13 + 1;
              printf("%5d",(ulong)__s[lVar6]);
            } while (lVar13 != 4);
            printf("  ...");
            lVar13 = 0;
            do {
              printf("%5d",(ulong)puVar20[lVar13]);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 5);
          }
          putchar(10);
          lVar14 = lVar14 + 1;
          puVar20 = puVar20 + 1;
          uVar17 = uVar1;
        } while (uVar1 != uVar19);
      }
      if (local_8c != pVVar4->nSize) {
        __assert_fail("iStop == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x1b1,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      if (__s_01 != (void *)0x0) {
        free(__s_01);
      }
      if (__s != (uint *)0x0) {
        free(__s);
      }
      if (__s_00 == (int *)0x0) {
        return;
      }
      free(__s_00);
      return;
    }
  }
LAB_005f1a81:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManPrintObjClasses( Gia_Man_t * p )
{
    Vec_Int_t * vSeens;  // objects seen so far
    Vec_Int_t * vAbs = p->vObjClasses;
    int i, k, Entry, iStart, iStop = -1, nFrames;
    int nObjBits, nObjMask, iObj, iFrame, nWords;
    unsigned * pInfo;
    int * pCountAll, * pCountUni;
    if ( vAbs == NULL )
        return;
    nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    pCountAll = ABC_ALLOC( int, nFrames + 1 );
    pCountUni = ABC_ALLOC( int, nFrames + 1 );
    // start storage for seen objects
    nWords = Abc_BitWordNum( nFrames );
    vSeens = Vec_IntStart( Gia_ManObjNum(p) * nWords );
    // get the bitmasks
    nObjBits = Abc_Base2Log( Gia_ManObjNum(p) );
    nObjMask = (1 << nObjBits) - 1;
    assert( Gia_ManObjNum(p) <= nObjMask );
    // print info about frames
    printf( "Frame   Core   F0   F1   F2   F3 ...\n" );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        memset( pCountAll, 0, sizeof(int) * (nFrames + 1) );
        memset( pCountUni, 0, sizeof(int) * (nFrames + 1) );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
        {
            iObj   = (Entry &  nObjMask);
            iFrame = (Entry >> nObjBits);
            pInfo  = (unsigned *)Vec_IntEntryP( vSeens, nWords * iObj );
            if ( Abc_InfoHasBit(pInfo, iFrame) == 0 )
            {
                Abc_InfoSetBit( pInfo, iFrame );
                pCountUni[iFrame+1]++;
                pCountUni[0]++;
            }
            pCountAll[iFrame+1]++;
            pCountAll[0]++;
        }
        assert( pCountAll[0] == (iStop - iStart) );
//        printf( "%5d%5d  ", pCountAll[0], pCountUni[0] ); 
        printf( "%3d :", i );
        printf( "%7d", pCountAll[0] ); 
        if ( i >= 10 )
        {
            for ( k = 0; k < 4; k++ )
                printf( "%5d", pCountAll[k+1] ); 
            printf( "  ..." );
            for ( k = i-4; k <= i; k++ )
                printf( "%5d", pCountAll[k+1] ); 
        }
        else
        {
            for ( k = 0; k <= i; k++ )
                if ( k <= i )
                    printf( "%5d", pCountAll[k+1] ); 
        }
//        for ( k = 0; k < nFrames; k++ )
//            if ( k <= i )
//                printf( "%5d", pCountAll[k+1] ); 
        printf( "\n" );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    Vec_IntFree( vSeens );
    ABC_FREE( pCountAll );
    ABC_FREE( pCountUni );
}